

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O2

String * __thiscall
Args::GroupIface::name_abi_cxx11_(String *__return_storage_ptr__,GroupIface *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_name);
  return __return_storage_ptr__;
}

Assistant:

String name() const override
	{
		return m_name;
	}